

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

iterator __thiscall
cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer *ppcVar1;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar2;
  value_type index_entry;
  DependSetList *local_58;
  pair<const_cmLinkItem,_int> local_50;
  
  local_58 = (DependSetList *)
             CONCAT44(local_58._4_4_,
                      (int)((ulong)((long)(this->EntryList).
                                          super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->EntryList).
                                         super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555);
  std::pair<const_cmLinkItem,_int>::pair<int,_true>(&local_50,item,(int *)&local_58);
  pVar2 = std::
          _Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
          ::_M_emplace_unique<std::pair<cmLinkItem_const,int>&>
                    ((_Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
                      *)&this->LinkEntryIndex,&local_50);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  emplace_back<>(&this->EntryList);
  local_58 = (DependSetList *)0x0;
  std::
  vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
  ::emplace_back<cmComputeLinkDepends::DependSetList*>
            ((vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
              *)&this->InferredDependSets,&local_58);
  __position._M_current =
       (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->EntryConstraintGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::_M_realloc_insert<>
              (&(this->EntryConstraintGraph).
                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,__position);
  }
  else {
    ((__position._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ((__position._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ((__position._M_current)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ppcVar1 = &(this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  if (local_50.first.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.first.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first.String._M_dataplus._M_p != &local_50.first.String.field_2) {
    operator_delete(local_50.first.String._M_dataplus._M_p,
                    local_50.first.String.field_2._M_allocated_capacity + 1);
  }
  return (iterator)pVar2.first._M_node._M_node;
}

Assistant:

std::map<cmLinkItem, int>::iterator cmComputeLinkDepends::AllocateLinkEntry(
  cmLinkItem const& item)
{
  std::map<cmLinkItem, int>::value_type index_entry(
    item, static_cast<int>(this->EntryList.size()));
  std::map<cmLinkItem, int>::iterator lei =
    this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.emplace_back();
  this->InferredDependSets.push_back(nullptr);
  this->EntryConstraintGraph.emplace_back();
  return lei;
}